

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_Sequence::ChFunction_Sequence
          (ChFunction_Sequence *this,ChFunction_Sequence *other)

{
  list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *plVar1;
  
  plVar1 = &this->functions;
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Sequence_00b45f08;
  (this->functions).super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->functions).super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->functions).super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>.
  _M_impl._M_node._M_size = 0;
  this->start = other->start;
  if (this != other) {
    std::__cxx11::list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>>::
    _M_assign_dispatch<std::_List_const_iterator<chrono::ChFseqNode>>
              ((list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>> *)plVar1,
               (other->functions).
               super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl.
               _M_node.super__List_node_base._M_next,&other->functions);
  }
  return;
}

Assistant:

ChFunction_Sequence::ChFunction_Sequence(const ChFunction_Sequence& other) {
    start = other.start;
    functions = other.functions;
}